

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avg_intrin_avx2.c
# Opt level: O0

void aom_hadamard_32x32_avx2(int16_t *src_diff,ptrdiff_t src_stride,tran_low_t *coeff)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  __m256i zero_00;
  __m256i zero_01;
  __m256i zero_02;
  __m256i zero_03;
  __m256i in;
  __m256i in_00;
  __m256i in_01;
  __m256i in_02;
  __m256i a;
  __m256i a_00;
  __m256i a_01;
  __m256i a_02;
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  long in_RDX;
  __m256i coeff3;
  __m256i coeff2;
  __m256i coeff1;
  __m256i coeff0;
  int16_t *src_ptr;
  __m256i zero;
  __m256i b3;
  __m256i b2;
  __m256i b1;
  __m256i b0;
  __m256i b3_hi;
  __m256i b2_hi;
  __m256i b1_hi;
  __m256i b0_hi;
  __m256i coeff3_hi;
  __m256i coeff2_hi;
  __m256i coeff1_hi;
  __m256i coeff0_hi;
  __m256i b3_lo;
  __m256i b2_lo;
  __m256i b1_lo;
  __m256i b0_lo;
  __m256i coeff3_lo;
  __m256i coeff2_lo;
  __m256i coeff1_lo;
  __m256i coeff0_lo;
  int idx;
  int16_t *t_coeff;
  int16_t temp_coeff [1024];
  __m256i *out_hi;
  __m256i *out_lo;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  longlong lVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  longlong lVar26;
  tran_low_t *b;
  undefined8 uVar27;
  undefined8 uStack_1128;
  undefined8 local_1120;
  undefined8 uStack_1118;
  undefined8 uStack_1110;
  undefined8 uStack_1108;
  undefined8 local_1100;
  undefined8 uStack_10f8;
  undefined8 uStack_10f0;
  undefined8 uStack_10e8;
  undefined8 local_10e0;
  undefined8 uStack_10d8;
  undefined8 uStack_10d0;
  undefined8 uStack_10c8;
  undefined8 local_10c0;
  undefined8 uStack_10b8;
  undefined8 uStack_10b0;
  undefined8 uStack_10a8;
  undefined8 local_10a0;
  undefined8 uStack_1098;
  undefined8 uStack_1090;
  undefined8 uStack_1088;
  undefined8 local_1080;
  undefined8 uStack_1078;
  undefined8 uStack_1070;
  undefined8 uStack_1068;
  undefined8 local_1060;
  undefined8 uStack_1058;
  undefined8 uStack_1050;
  undefined8 uStack_1048;
  undefined8 local_1040;
  undefined8 uStack_1038;
  undefined8 uStack_1030;
  undefined8 uStack_1028;
  undefined8 local_1020;
  undefined8 uStack_1018;
  undefined8 uStack_1010;
  undefined8 uStack_1008;
  undefined8 local_1000;
  undefined8 uStack_ff8;
  undefined8 uStack_ff0;
  undefined8 uStack_fe8;
  undefined8 local_fe0;
  undefined8 uStack_fd8;
  undefined8 uStack_fd0;
  undefined8 uStack_fc8;
  undefined8 local_fc0;
  undefined8 uStack_fb8;
  undefined8 uStack_fb0;
  undefined8 uStack_fa8;
  undefined8 local_fa0;
  undefined8 uStack_f98;
  undefined8 uStack_f90;
  undefined8 uStack_f88;
  undefined8 local_f80;
  undefined8 uStack_f78;
  undefined8 uStack_f70;
  undefined8 uStack_f68;
  undefined8 local_f60;
  undefined8 uStack_f58;
  undefined8 uStack_f50;
  undefined8 uStack_f48;
  undefined8 local_f40;
  undefined8 uStack_f38;
  undefined8 uStack_f30;
  undefined8 uStack_f28;
  undefined8 local_f20;
  undefined8 uStack_f18;
  undefined8 uStack_f10;
  undefined8 uStack_f08;
  undefined8 local_f00;
  undefined8 uStack_ef8;
  undefined8 uStack_ef0;
  undefined4 uStack_ee8;
  int in_stack_fffffffffffff11c;
  tran_low_t *in_stack_fffffffffffff120;
  ptrdiff_t in_stack_fffffffffffff128;
  int16_t *in_stack_fffffffffffff130;
  undefined8 uStack_ec8;
  int local_eac;
  undefined8 *local_ea8;
  undefined8 local_ea0 [257];
  long local_698;
  undefined8 *local_680;
  undefined8 *local_678;
  undefined8 *local_670;
  undefined8 *local_668;
  undefined8 local_660;
  undefined8 uStack_658;
  longlong lStack_650;
  undefined8 uStack_648;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 uStack_630;
  undefined8 uStack_628;
  undefined8 local_620;
  undefined8 uStack_618;
  undefined8 uStack_610;
  undefined8 uStack_608;
  undefined8 local_600;
  undefined8 uStack_5f8;
  undefined8 uStack_5f0;
  undefined8 uStack_5e8;
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  longlong lStack_5d0;
  undefined8 uStack_5c8;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 uStack_5b0;
  undefined8 uStack_5a8;
  undefined8 local_5a0;
  undefined8 uStack_598;
  undefined8 uStack_590;
  undefined8 uStack_588;
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 uStack_570;
  undefined8 uStack_568;
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 uStack_550;
  undefined8 uStack_548;
  undefined4 local_324;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 uStack_310;
  undefined8 uStack_308;
  undefined4 local_2e4;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  undefined4 local_2a4;
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined4 local_264;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 uStack_250;
  undefined8 uStack_248;
  undefined4 local_224;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined4 local_1e4;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined4 local_1a4;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  undefined4 local_164;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 uStack_130;
  undefined8 uStack_128;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 uStack_110;
  undefined8 uStack_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 uStack_90;
  undefined8 uStack_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 uStack_70;
  undefined8 uStack_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  
  local_ea8 = local_ea0;
  local_560 = 0;
  uStack_558 = 0;
  uStack_550 = 0;
  uStack_548 = 0;
  b = (tran_low_t *)0x0;
  uVar27 = 0;
  local_698 = in_RDX;
  for (local_eac = 0; local_eac < 4; local_eac = local_eac + 1) {
    hadamard_16x16_avx2(in_stack_fffffffffffff130,in_stack_fffffffffffff128,
                        in_stack_fffffffffffff120,in_stack_fffffffffffff11c);
  }
  for (local_eac = 0; local_eac < 0x100; local_eac = local_eac + 0x10) {
    local_668 = local_ea8;
    uVar24 = *local_ea8;
    uVar25 = local_ea8[1];
    lVar26 = local_ea8[2];
    local_670 = local_ea8 + 0x40;
    uVar20 = *local_670;
    uVar21 = local_ea8[0x41];
    lVar22 = local_ea8[0x42];
    uVar23 = local_ea8[0x43];
    local_678 = local_ea8 + 0x80;
    out_hi = (__m256i *)local_ea8[0x81];
    out_lo = (__m256i *)local_ea8[0x82];
    uVar19 = local_ea8[0x83];
    local_680 = local_ea8 + 0xc0;
    in[1] = uVar24;
    in[0] = uVar23;
    in[2] = uVar25;
    in[3] = lVar26;
    zero_00[1] = uVar20;
    zero_00[0] = uVar19;
    zero_00[2] = uVar21;
    zero_00[3] = lVar22;
    sign_extend_16bit_to_32bit_avx2(in,zero_00,out_lo,out_hi);
    in_00[1] = uVar24;
    in_00[0] = uVar23;
    in_00[2] = uVar25;
    in_00[3] = lVar26;
    zero_01[1] = uVar20;
    zero_01[0] = uVar19;
    zero_01[2] = uVar21;
    zero_01[3] = lVar22;
    sign_extend_16bit_to_32bit_avx2(in_00,zero_01,out_lo,out_hi);
    in_01[1] = uVar24;
    in_01[0] = uVar23;
    in_01[2] = uVar25;
    in_01[3] = lVar26;
    zero_02[1] = uVar20;
    zero_02[0] = uVar19;
    zero_02[2] = uVar21;
    zero_02[3] = lVar22;
    sign_extend_16bit_to_32bit_avx2(in_01,zero_02,out_lo,out_hi);
    in_02[1] = uVar24;
    in_02[0] = uVar23;
    in_02[2] = uVar25;
    in_02[3] = lVar26;
    zero_03[1] = uVar20;
    zero_03[0] = uVar19;
    zero_03[2] = uVar21;
    zero_03[3] = lVar22;
    sign_extend_16bit_to_32bit_avx2(in_02,zero_03,out_lo,out_hi);
    auVar6._28_4_ = in_stack_fffffffffffff11c;
    auVar6._24_4_ = uStack_ee8;
    auVar10._8_8_ = in_stack_fffffffffffff128;
    auVar10._0_8_ = in_stack_fffffffffffff120;
    auVar10._16_8_ = in_stack_fffffffffffff130;
    auVar10._24_8_ = uStack_ec8;
    auVar6._8_8_ = uStack_ef8;
    auVar6._0_8_ = local_f00;
    auVar6._16_8_ = uStack_ef0;
    auVar1 = vpaddd_avx2(auVar10,auVar6);
    auVar5._8_8_ = uStack_fd8;
    auVar5._0_8_ = local_fe0;
    auVar5._16_8_ = uStack_fd0;
    auVar5._24_8_ = uStack_fc8;
    auVar2._8_8_ = uStack_ff8;
    auVar2._0_8_ = local_1000;
    auVar2._16_8_ = uStack_ff0;
    auVar2._24_8_ = uStack_fe8;
    auVar2 = vpaddd_avx2(auVar5,auVar2);
    auVar17._28_4_ = in_stack_fffffffffffff11c;
    auVar17._24_4_ = uStack_ee8;
    auVar18._8_8_ = in_stack_fffffffffffff128;
    auVar18._0_8_ = in_stack_fffffffffffff120;
    auVar18._16_8_ = in_stack_fffffffffffff130;
    auVar18._24_8_ = uStack_ec8;
    auVar17._8_8_ = uStack_ef8;
    auVar17._0_8_ = local_f00;
    auVar17._16_8_ = uStack_ef0;
    auVar5 = vpsubd_avx2(auVar18,auVar17);
    auVar16._8_8_ = uStack_fd8;
    auVar16._0_8_ = local_fe0;
    auVar16._16_8_ = uStack_fd0;
    auVar16._24_8_ = uStack_fc8;
    auVar15._8_8_ = uStack_ff8;
    auVar15._0_8_ = local_1000;
    auVar15._16_8_ = uStack_ff0;
    auVar15._24_8_ = uStack_fe8;
    auVar6 = vpsubd_avx2(auVar16,auVar15);
    auVar9._8_8_ = uStack_f18;
    auVar9._0_8_ = local_f20;
    auVar9._16_8_ = uStack_f10;
    auVar9._24_8_ = uStack_f08;
    auVar3._8_8_ = uStack_f38;
    auVar3._0_8_ = local_f40;
    auVar3._16_8_ = uStack_f30;
    auVar3._24_8_ = uStack_f28;
    auVar3 = vpaddd_avx2(auVar9,auVar3);
    auVar8._8_8_ = uStack_1018;
    auVar8._0_8_ = local_1020;
    auVar8._16_8_ = uStack_1010;
    auVar8._24_8_ = uStack_1008;
    auVar7._8_8_ = uStack_1038;
    auVar7._0_8_ = local_1040;
    auVar7._16_8_ = uStack_1030;
    auVar7._24_8_ = uStack_1028;
    auVar4 = vpaddd_avx2(auVar8,auVar7);
    auVar14._8_8_ = uStack_f18;
    auVar14._0_8_ = local_f20;
    auVar14._16_8_ = uStack_f10;
    auVar14._24_8_ = uStack_f08;
    auVar13._8_8_ = uStack_f38;
    auVar13._0_8_ = local_f40;
    auVar13._16_8_ = uStack_f30;
    auVar13._24_8_ = uStack_f28;
    auVar7 = vpsubd_avx2(auVar14,auVar13);
    auVar12._8_8_ = uStack_1018;
    auVar12._0_8_ = local_1020;
    auVar12._16_8_ = uStack_1010;
    auVar12._24_8_ = uStack_1008;
    auVar11._8_8_ = uStack_1038;
    auVar11._0_8_ = local_1040;
    auVar11._16_8_ = uStack_1030;
    auVar11._24_8_ = uStack_1028;
    auVar8 = vpsubd_avx2(auVar12,auVar11);
    local_f60 = auVar1._0_8_;
    uStack_f58 = auVar1._8_8_;
    uStack_f50 = auVar1._16_8_;
    uStack_f48 = auVar1._24_8_;
    local_160 = local_f60;
    uStack_158 = uStack_f58;
    uStack_150 = uStack_f50;
    uStack_148 = uStack_f48;
    local_164 = 2;
    auVar1 = vpsrad_avx2(auVar1,ZEXT416(2));
    local_f80 = auVar5._0_8_;
    uStack_f78 = auVar5._8_8_;
    uStack_f70 = auVar5._16_8_;
    uStack_f68 = auVar5._24_8_;
    local_1a0 = local_f80;
    uStack_198 = uStack_f78;
    uStack_190 = uStack_f70;
    uStack_188 = uStack_f68;
    local_1a4 = 2;
    auVar5 = vpsrad_avx2(auVar5,ZEXT416(2));
    local_fa0 = auVar3._0_8_;
    uStack_f98 = auVar3._8_8_;
    uStack_f90 = auVar3._16_8_;
    uStack_f88 = auVar3._24_8_;
    local_1e0 = local_fa0;
    uStack_1d8 = uStack_f98;
    uStack_1d0 = uStack_f90;
    uStack_1c8 = uStack_f88;
    local_1e4 = 2;
    auVar3 = vpsrad_avx2(auVar3,ZEXT416(2));
    local_fc0 = auVar7._0_8_;
    uStack_fb8 = auVar7._8_8_;
    uStack_fb0 = auVar7._16_8_;
    uStack_fa8 = auVar7._24_8_;
    local_220 = local_fc0;
    uStack_218 = uStack_fb8;
    uStack_210 = uStack_fb0;
    uStack_208 = uStack_fa8;
    local_224 = 2;
    auVar7 = vpsrad_avx2(auVar7,ZEXT416(2));
    local_1060 = auVar2._0_8_;
    uStack_1058 = auVar2._8_8_;
    uStack_1050 = auVar2._16_8_;
    uStack_1048 = auVar2._24_8_;
    local_260 = local_1060;
    uStack_258 = uStack_1058;
    uStack_250 = uStack_1050;
    uStack_248 = uStack_1048;
    local_264 = 2;
    auVar2 = vpsrad_avx2(auVar2,ZEXT416(2));
    local_1080 = auVar6._0_8_;
    uStack_1078 = auVar6._8_8_;
    uStack_1070 = auVar6._16_8_;
    uStack_1068 = auVar6._24_8_;
    local_2a0 = local_1080;
    uStack_298 = uStack_1078;
    uStack_290 = uStack_1070;
    uStack_288 = uStack_1068;
    local_2a4 = 2;
    auVar6 = vpsrad_avx2(auVar6,ZEXT416(2));
    local_10a0 = auVar4._0_8_;
    uStack_1098 = auVar4._8_8_;
    uStack_1090 = auVar4._16_8_;
    uStack_1088 = auVar4._24_8_;
    local_2e0 = local_10a0;
    uStack_2d8 = uStack_1098;
    uStack_2d0 = uStack_1090;
    uStack_2c8 = uStack_1088;
    local_2e4 = 2;
    auVar4 = vpsrad_avx2(auVar4,ZEXT416(2));
    local_10c0 = auVar8._0_8_;
    uStack_10b8 = auVar8._8_8_;
    uStack_10b0 = auVar8._16_8_;
    uStack_10a8 = auVar8._24_8_;
    local_320 = local_10c0;
    uStack_318 = uStack_10b8;
    uStack_310 = uStack_10b0;
    uStack_308 = uStack_10a8;
    local_324 = 2;
    auVar8 = vpsrad_avx2(auVar8,ZEXT416(2));
    local_f60 = auVar1._0_8_;
    uStack_f58 = auVar1._8_8_;
    uStack_f50 = auVar1._16_8_;
    uStack_f48 = auVar1._24_8_;
    local_1060 = auVar2._0_8_;
    uStack_1058 = auVar2._8_8_;
    uStack_1050 = auVar2._16_8_;
    uStack_1048 = auVar2._24_8_;
    local_60 = local_f60;
    uStack_58 = uStack_f58;
    uStack_50 = uStack_f50;
    uStack_48 = uStack_f48;
    local_80 = local_1060;
    uStack_78 = uStack_1058;
    uStack_70 = uStack_1050;
    uStack_68 = uStack_1048;
    auVar1 = vpackssdw_avx2(auVar1,auVar2);
    local_f80 = auVar5._0_8_;
    uStack_f78 = auVar5._8_8_;
    uStack_f70 = auVar5._16_8_;
    uStack_f68 = auVar5._24_8_;
    local_1080 = auVar6._0_8_;
    uStack_1078 = auVar6._8_8_;
    uStack_1070 = auVar6._16_8_;
    uStack_1068 = auVar6._24_8_;
    local_a0 = local_f80;
    uStack_98 = uStack_f78;
    uStack_90 = uStack_f70;
    uStack_88 = uStack_f68;
    local_c0 = local_1080;
    uStack_b8 = uStack_1078;
    uStack_b0 = uStack_1070;
    uStack_a8 = uStack_1068;
    auVar2 = vpackssdw_avx2(auVar5,auVar6);
    local_fa0 = auVar3._0_8_;
    uStack_f98 = auVar3._8_8_;
    uStack_f90 = auVar3._16_8_;
    uStack_f88 = auVar3._24_8_;
    local_10a0 = auVar4._0_8_;
    uStack_1098 = auVar4._8_8_;
    uStack_1090 = auVar4._16_8_;
    uStack_1088 = auVar4._24_8_;
    local_e0 = local_fa0;
    uStack_d8 = uStack_f98;
    uStack_d0 = uStack_f90;
    uStack_c8 = uStack_f88;
    local_100 = local_10a0;
    uStack_f8 = uStack_1098;
    uStack_f0 = uStack_1090;
    uStack_e8 = uStack_1088;
    auVar3 = vpackssdw_avx2(auVar3,auVar4);
    local_fc0 = auVar7._0_8_;
    uStack_fb8 = auVar7._8_8_;
    uStack_fb0 = auVar7._16_8_;
    uStack_fa8 = auVar7._24_8_;
    local_10c0 = auVar8._0_8_;
    uStack_10b8 = auVar8._8_8_;
    uStack_10b0 = auVar8._16_8_;
    uStack_10a8 = auVar8._24_8_;
    local_120 = local_fc0;
    uStack_118 = uStack_fb8;
    uStack_110 = uStack_fb0;
    uStack_108 = uStack_fa8;
    local_140 = local_10c0;
    uStack_138 = uStack_10b8;
    uStack_130 = uStack_10b0;
    uStack_128 = uStack_10a8;
    auVar4 = vpackssdw_avx2(auVar7,auVar8);
    uVar24 = auVar4._0_8_;
    uVar25 = auVar4._8_8_;
    lVar26 = auVar4._16_8_;
    uStack_1128 = auVar4._24_8_;
    local_10e0 = auVar1._0_8_;
    uStack_10d8 = auVar1._8_8_;
    uStack_10d0 = auVar1._16_8_;
    uStack_10c8 = auVar1._24_8_;
    local_1120 = auVar3._0_8_;
    uStack_1118 = auVar3._8_8_;
    uStack_1110 = auVar3._16_8_;
    uStack_1108 = auVar3._24_8_;
    local_600 = local_10e0;
    uStack_5f8 = uStack_10d8;
    uStack_5f0 = uStack_10d0;
    uStack_5e8 = uStack_10c8;
    local_620 = local_1120;
    uStack_618 = uStack_1118;
    uStack_610 = uStack_1110;
    uStack_608 = uStack_1108;
    vpaddw_avx2(auVar1,auVar3);
    a[1] = uVar24;
    a[0] = uVar27;
    a[2] = uVar25;
    a[3] = lVar26;
    store_tran_low(a,b);
    local_1100 = auVar2._0_8_;
    uStack_10f8 = auVar2._8_8_;
    uStack_10f0 = auVar2._16_8_;
    uStack_10e8 = auVar2._24_8_;
    local_640 = local_1100;
    uStack_638 = uStack_10f8;
    uStack_630 = uStack_10f0;
    uStack_628 = uStack_10e8;
    uStack_648 = uStack_1128;
    auVar4._8_8_ = uVar25;
    auVar4._0_8_ = uVar24;
    auVar4._16_8_ = lVar26;
    auVar4._24_8_ = uStack_1128;
    vpaddw_avx2(auVar2,auVar4);
    a_00[1] = uVar24;
    a_00[0] = uVar27;
    a_00[2] = uVar25;
    a_00[3] = lVar26;
    local_660 = uVar24;
    uStack_658 = uVar25;
    lStack_650 = lVar26;
    store_tran_low(a_00,b);
    local_580 = local_10e0;
    uStack_578 = uStack_10d8;
    uStack_570 = uStack_10d0;
    uStack_568 = uStack_10c8;
    local_5a0 = local_1120;
    uStack_598 = uStack_1118;
    uStack_590 = uStack_1110;
    uStack_588 = uStack_1108;
    vpsubw_avx2(auVar1,auVar3);
    a_01[1] = uVar24;
    a_01[0] = uVar27;
    a_01[2] = uVar25;
    a_01[3] = lVar26;
    store_tran_low(a_01,b);
    local_5c0 = local_1100;
    uStack_5b8 = uStack_10f8;
    uStack_5b0 = uStack_10f0;
    uStack_5a8 = uStack_10e8;
    uStack_5c8 = uStack_1128;
    auVar1._8_8_ = uVar25;
    auVar1._0_8_ = uVar24;
    auVar1._16_8_ = lVar26;
    auVar1._24_8_ = uStack_1128;
    vpsubw_avx2(auVar2,auVar1);
    a_02[1] = uVar24;
    a_02[0] = uVar27;
    a_02[2] = uVar25;
    a_02[3] = lVar26;
    local_5e0 = uVar24;
    uStack_5d8 = uVar25;
    lStack_5d0 = lVar26;
    store_tran_low(a_02,b);
    local_698 = local_698 + 0x40;
    local_ea8 = local_ea8 + 4;
  }
  return;
}

Assistant:

void aom_hadamard_32x32_avx2(const int16_t *src_diff, ptrdiff_t src_stride,
                             tran_low_t *coeff) {
  // For high bitdepths, it is unnecessary to store_tran_low
  // (mult/unpack/store), then load_tran_low (load/pack) the same memory in the
  // next stage.  Output to an intermediate buffer first, then store_tran_low()
  // in the final stage.
  DECLARE_ALIGNED(32, int16_t, temp_coeff[32 * 32]);
  int16_t *t_coeff = temp_coeff;
  int idx;
  __m256i coeff0_lo, coeff1_lo, coeff2_lo, coeff3_lo, b0_lo, b1_lo, b2_lo,
      b3_lo;
  __m256i coeff0_hi, coeff1_hi, coeff2_hi, coeff3_hi, b0_hi, b1_hi, b2_hi,
      b3_hi;
  __m256i b0, b1, b2, b3;
  const __m256i zero = _mm256_setzero_si256();
  for (idx = 0; idx < 4; ++idx) {
    // src_diff: 9 bit, dynamic range [-255, 255]
    const int16_t *src_ptr =
        src_diff + (idx >> 1) * 16 * src_stride + (idx & 0x01) * 16;
    hadamard_16x16_avx2(src_ptr, src_stride,
                        (tran_low_t *)(t_coeff + idx * 256), 0);
  }

  for (idx = 0; idx < 256; idx += 16) {
    const __m256i coeff0 = _mm256_loadu_si256((const __m256i *)t_coeff);
    const __m256i coeff1 = _mm256_loadu_si256((const __m256i *)(t_coeff + 256));
    const __m256i coeff2 = _mm256_loadu_si256((const __m256i *)(t_coeff + 512));
    const __m256i coeff3 = _mm256_loadu_si256((const __m256i *)(t_coeff + 768));

    // Sign extend 16 bit to 32 bit.
    sign_extend_16bit_to_32bit_avx2(coeff0, zero, &coeff0_lo, &coeff0_hi);
    sign_extend_16bit_to_32bit_avx2(coeff1, zero, &coeff1_lo, &coeff1_hi);
    sign_extend_16bit_to_32bit_avx2(coeff2, zero, &coeff2_lo, &coeff2_hi);
    sign_extend_16bit_to_32bit_avx2(coeff3, zero, &coeff3_lo, &coeff3_hi);

    b0_lo = _mm256_add_epi32(coeff0_lo, coeff1_lo);
    b0_hi = _mm256_add_epi32(coeff0_hi, coeff1_hi);

    b1_lo = _mm256_sub_epi32(coeff0_lo, coeff1_lo);
    b1_hi = _mm256_sub_epi32(coeff0_hi, coeff1_hi);

    b2_lo = _mm256_add_epi32(coeff2_lo, coeff3_lo);
    b2_hi = _mm256_add_epi32(coeff2_hi, coeff3_hi);

    b3_lo = _mm256_sub_epi32(coeff2_lo, coeff3_lo);
    b3_hi = _mm256_sub_epi32(coeff2_hi, coeff3_hi);

    b0_lo = _mm256_srai_epi32(b0_lo, 2);
    b1_lo = _mm256_srai_epi32(b1_lo, 2);
    b2_lo = _mm256_srai_epi32(b2_lo, 2);
    b3_lo = _mm256_srai_epi32(b3_lo, 2);

    b0_hi = _mm256_srai_epi32(b0_hi, 2);
    b1_hi = _mm256_srai_epi32(b1_hi, 2);
    b2_hi = _mm256_srai_epi32(b2_hi, 2);
    b3_hi = _mm256_srai_epi32(b3_hi, 2);

    b0 = _mm256_packs_epi32(b0_lo, b0_hi);
    b1 = _mm256_packs_epi32(b1_lo, b1_hi);
    b2 = _mm256_packs_epi32(b2_lo, b2_hi);
    b3 = _mm256_packs_epi32(b3_lo, b3_hi);

    store_tran_low(_mm256_add_epi16(b0, b2), coeff);
    store_tran_low(_mm256_add_epi16(b1, b3), coeff + 256);
    store_tran_low(_mm256_sub_epi16(b0, b2), coeff + 512);
    store_tran_low(_mm256_sub_epi16(b1, b3), coeff + 768);

    coeff += 16;
    t_coeff += 16;
  }
}